

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

void __thiscall
SVGChart::PlotDataContainer::AddXYPlot
          (PlotDataContainer *this,PlotDataBase *inXData,PlotDataBase *inYData,
          LegendData *inLegendData,DataDrawerBase *inDataDrawer,
          PlotDataSelection *inPlotDataSelection)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DummyData *this_00;
  long inSize;
  LegendData *this_01;
  LineDataDrawer *this_02;
  size_type __new_size;
  PlotDataSelection *this_03;
  PlotDataSelection *thePlotDataSelection;
  DataDrawerBase *theDataDrawer;
  LegendData *theLegendData;
  PlotDataBase *theXData;
  PlotDataBase *inYData_local;
  
  if (inYData != (PlotDataBase *)0x0) {
    inYData_local = inYData;
    iVar1 = (*inYData->_vptr_PlotDataBase[2])(inYData);
    if ((CONCAT44(extraout_var,iVar1) == 0) &&
       (iVar1 = (*inYData->_vptr_PlotDataBase[3])(inYData), CONCAT44(extraout_var_00,iVar1) == 0)) {
      return;
    }
    theXData = inXData;
    if (inXData == (PlotDataBase *)0x0) {
      theXData = inXData;
      this_00 = (DummyData *)operator_new(0x20);
      inSize = PlotDataBase::GetSize(inYData);
      DummyData::DummyData(this_00,inSize);
      theXData = (PlotDataBase *)this_00;
    }
    std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>::push_back
              (&this->mXDataList,&theXData);
    std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>::push_back
              (&this->mYDataList,&inYData_local);
    theLegendData = inLegendData;
    if (inLegendData == (LegendData *)0x0) {
      this_01 = (LegendData *)operator_new(0xa8);
      LegendData::LegendData(this_01);
      theLegendData = this_01;
      LegendData::SetDefaultValues
                (this_01,(int)((ulong)((long)(this->mLegendDataList).
                                             super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this->mLegendDataList).
                                            super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3));
    }
    std::vector<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>::push_back
              (&this->mLegendDataList,&theLegendData);
    theDataDrawer = inDataDrawer;
    if (inDataDrawer == (DataDrawerBase *)0x0) {
      theDataDrawer = inDataDrawer;
      this_02 = (LineDataDrawer *)operator_new(0xa8);
      LineDataDrawer::LineDataDrawer(this_02);
      theDataDrawer = (DataDrawerBase *)this_02;
    }
    std::vector<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>::push_back
              (&this->mDataDrawerList,&theDataDrawer);
    thePlotDataSelection = inPlotDataSelection;
    if (inPlotDataSelection == (PlotDataSelection *)0x0) {
      this_03 = (PlotDataSelection *)operator_new(0x18);
      PlotDataSelection::PlotDataSelection(this_03,0);
      thePlotDataSelection = this_03;
    }
    else {
      __new_size = PlotDataBase::GetSize(inYData_local);
      std::vector<int,_std::allocator<int>_>::resize
                (&inPlotDataSelection->super_vector<int,_std::allocator<int>_>,__new_size);
    }
    std::vector<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>::
    push_back(&this->mPlotDataSelectionList,&thePlotDataSelection);
  }
  return;
}

Assistant:

void PlotDataContainer::AddXYPlot (PlotDataBase *inXData, PlotDataBase *inYData, LegendData *inLegendData, DataDrawerBase *inDataDrawer, PlotDataSelection *inPlotDataSelection) {
      if (!inYData || (!inYData->GetRealPlotData () && !inYData->GetCalculatedData ())) {
        return;
      }
      PlotDataBase *theXData = inXData;
      if (!theXData) {
        theXData = new DummyData (inYData->GetSize ());
      }
      mXDataList.push_back (theXData);
      mYDataList.push_back (inYData);

      LegendData *theLegendData = inLegendData;
      if (!theLegendData) {
        theLegendData = new LegendData ();
        theLegendData->SetDefaultValues (mLegendDataList.size ());
      }
      mLegendDataList.push_back (theLegendData);

      DataDrawerBase *theDataDrawer = inDataDrawer;
      if (!theDataDrawer) {
        theDataDrawer = new LineDataDrawer ();
      }
      mDataDrawerList.push_back (theDataDrawer);

      PlotDataSelection *thePlotDataSelection = inPlotDataSelection;
      if (!thePlotDataSelection) {
        thePlotDataSelection = new PlotDataSelection ();
      }
      else {
        thePlotDataSelection->resize (inYData->GetSize ());
      }
      mPlotDataSelectionList.push_back (thePlotDataSelection);
    }